

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCharEncCloseFunc(xmlCharEncodingHandler *handler)

{
  if ((handler != (xmlCharEncodingHandler *)0x0) && ((handler->flags & 1) == 0)) {
    (*xmlFree)(handler->name);
    if (handler->ctxtDtor != (xmlCharEncConvCtxtDtor)0x0) {
      (*handler->ctxtDtor)(handler->inputCtxt);
      (*handler->ctxtDtor)(handler->outputCtxt);
    }
    (*xmlFree)(handler);
  }
  return 0;
}

Assistant:

int
xmlCharEncCloseFunc(xmlCharEncodingHandler *handler) {
    if (handler == NULL)
        return(0);

    if (handler->flags & XML_HANDLER_STATIC)
        return(0);

    xmlFree(handler->name);
    if (handler->ctxtDtor != NULL) {
        handler->ctxtDtor(handler->inputCtxt);
        handler->ctxtDtor(handler->outputCtxt);
    }
    xmlFree(handler);
    return(0);
}